

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlCreatePushParserCtxt(void)

{
  int iVar1;
  int iVar2;
  xmlCharEncoding val;
  htmlSAXHandlerPtr val_00;
  void *val_01;
  char *__s;
  char *val_02;
  size_t sVar3;
  htmlParserCtxtPtr val_03;
  int local_64;
  int n_enc;
  xmlCharEncoding enc;
  int n_filename;
  char *filename;
  int n_size;
  int size;
  int n_chunk;
  char *chunk;
  int n_user_data;
  void *user_data;
  int n_sax;
  htmlSAXHandlerPtr sax;
  htmlParserCtxtPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (user_data._4_4_ = 0; (int)user_data._4_4_ < 1; user_data._4_4_ = user_data._4_4_ + 1) {
    for (chunk._4_4_ = 0; (int)chunk._4_4_ < 3; chunk._4_4_ = chunk._4_4_ + 1) {
      for (n_size = 0; n_size < 4; n_size = n_size + 1) {
        for (filename._4_4_ = 0; (int)filename._4_4_ < 4; filename._4_4_ = filename._4_4_ + 1) {
          for (n_enc = 0; n_enc < 6; n_enc = n_enc + 1) {
            for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
              iVar1 = xmlMemBlocks();
              val_00 = gen_htmlSAXHandlerPtr(user_data._4_4_,0);
              val_01 = gen_userdata(chunk._4_4_,1);
              __s = gen_const_char_ptr(n_size,2);
              iVar2 = gen_int(filename._4_4_,3);
              val_02 = gen_fileoutput(n_enc,4);
              val = gen_xmlCharEncoding(local_64,5);
              if ((__s == (char *)0x0) || (sVar3 = strlen(__s), iVar2 <= (int)sVar3 + 1)) {
                val_03 = (htmlParserCtxtPtr)
                         htmlCreatePushParserCtxt(val_00,val_01,__s,iVar2,val_02,val);
                desret_htmlParserCtxtPtr(val_03);
                call_tests = call_tests + 1;
                des_htmlSAXHandlerPtr(user_data._4_4_,val_00,0);
                des_userdata(chunk._4_4_,val_01,1);
                des_const_char_ptr(n_size,__s,2);
                des_int(filename._4_4_,iVar2,3);
                des_fileoutput(n_enc,val_02,4);
                des_xmlCharEncoding(local_64,val,5);
                xmlResetLastError();
                iVar2 = xmlMemBlocks();
                if (iVar1 != iVar2) {
                  iVar2 = xmlMemBlocks();
                  printf("Leak of %d blocks found in htmlCreatePushParserCtxt",
                         (ulong)(uint)(iVar2 - iVar1));
                  ret_val._4_4_ = ret_val._4_4_ + 1;
                  printf(" %d",(ulong)user_data._4_4_);
                  printf(" %d",(ulong)chunk._4_4_);
                  printf(" %d",(ulong)(uint)n_size);
                  printf(" %d",(ulong)filename._4_4_);
                  printf(" %d",(ulong)(uint)n_enc);
                  printf(" %d");
                  printf("\n");
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_htmlCreatePushParserCtxt(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED) && defined(LIBXML_PUSH_ENABLED)
    int mem_base;
    htmlParserCtxtPtr ret_val;
    htmlSAXHandlerPtr sax; /* a SAX handler */
    int n_sax;
    void * user_data; /* The user data returned on SAX callbacks */
    int n_user_data;
    char * chunk; /* a pointer to an array of chars */
    int n_chunk;
    int size; /* number of chars in the array */
    int n_size;
    const char * filename; /* an optional file name or URI */
    int n_filename;
    xmlCharEncoding enc; /* an optional encoding */
    int n_enc;

    for (n_sax = 0;n_sax < gen_nb_htmlSAXHandlerPtr;n_sax++) {
    for (n_user_data = 0;n_user_data < gen_nb_userdata;n_user_data++) {
    for (n_chunk = 0;n_chunk < gen_nb_const_char_ptr;n_chunk++) {
    for (n_size = 0;n_size < gen_nb_int;n_size++) {
    for (n_filename = 0;n_filename < gen_nb_fileoutput;n_filename++) {
    for (n_enc = 0;n_enc < gen_nb_xmlCharEncoding;n_enc++) {
        mem_base = xmlMemBlocks();
        sax = gen_htmlSAXHandlerPtr(n_sax, 0);
        user_data = gen_userdata(n_user_data, 1);
        chunk = gen_const_char_ptr(n_chunk, 2);
        size = gen_int(n_size, 3);
        filename = gen_fileoutput(n_filename, 4);
        enc = gen_xmlCharEncoding(n_enc, 5);
        if ((chunk != NULL) &&
            (size > (int) strlen((const char *) chunk) + 1))
            continue;

        ret_val = htmlCreatePushParserCtxt(sax, user_data, (const char *)chunk, size, filename, enc);
        desret_htmlParserCtxtPtr(ret_val);
        call_tests++;
        des_htmlSAXHandlerPtr(n_sax, sax, 0);
        des_userdata(n_user_data, user_data, 1);
        des_const_char_ptr(n_chunk, (const char *)chunk, 2);
        des_int(n_size, size, 3);
        des_fileoutput(n_filename, filename, 4);
        des_xmlCharEncoding(n_enc, enc, 5);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlCreatePushParserCtxt",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_sax);
            printf(" %d", n_user_data);
            printf(" %d", n_chunk);
            printf(" %d", n_size);
            printf(" %d", n_filename);
            printf(" %d", n_enc);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}